

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::ParseCppFile
          (cmQtAutoGenerators *this,string *absFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headerExtensions,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *includedMocs,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  _Alloc_hider string;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  char *pcVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  bool bVar8;
  char *pcVar9;
  cmQtAutoGenerators *this_00;
  string scannedFileBasename;
  string *local_270;
  string headerToMoc_1;
  string macroName;
  string contentsString;
  string absPath;
  string ownMocUnderscoreFile;
  string ownMocHeaderFile;
  string headerToMoc;
  string mocSubDir;
  string currentMoc;
  string ownDotMocFile;
  string basename;
  RegularExpression mocIncludeRegExp;
  
  cmsys::RegularExpression::RegularExpression
            (&mocIncludeRegExp,
             "[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  ReadAll(&contentsString,absFilename);
  if (contentsString._M_string_length == 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
    poVar7 = std::operator<<(poVar7,(string *)absFilename);
    poVar7 = std::operator<<(poVar7,": file is empty\n");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    ParseForUic(this,absFilename,&contentsString,includedUis);
    if ((this->MocExecutable)._M_string_length != 0) {
      cmsys::SystemTools::GetRealPath(&macroName,absFilename,(string *)0x0);
      cmsys::SystemTools::GetFilenamePath(&scannedFileBasename,&macroName);
      std::operator+(&absPath,&scannedFileBasename,'/');
      std::__cxx11::string::~string((string *)&scannedFileBasename);
      std::__cxx11::string::~string((string *)&macroName);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&scannedFileBasename,absFilename);
      macroName._M_dataplus._M_p = (pointer)&macroName.field_2;
      macroName._M_string_length = 0;
      macroName.field_2._M_local_buf[0] = '\0';
      bVar1 = requiresMocing(&contentsString,&macroName);
      string = contentsString._M_dataplus;
      ownMocUnderscoreFile._M_dataplus._M_p = (pointer)&ownMocUnderscoreFile.field_2;
      ownMocUnderscoreFile._M_string_length = 0;
      bVar2 = false;
      ownDotMocFile._M_dataplus._M_p = (pointer)&ownDotMocFile.field_2;
      ownDotMocFile._M_string_length = 0;
      ownMocHeaderFile._M_dataplus._M_p = (pointer)&ownMocHeaderFile.field_2;
      ownMocHeaderFile._M_string_length = 0;
      ownMocUnderscoreFile.field_2._M_local_buf[0] = '\0';
      ownDotMocFile.field_2._M_local_buf[0] = '\0';
      ownMocHeaderFile.field_2._M_local_buf[0] = '\0';
      pcVar5 = strstr(contentsString._M_dataplus._M_p,"moc");
      bVar8 = true;
      if (pcVar5 != (char *)0x0) {
        bVar2 = cmsys::RegularExpression::find(&mocIncludeRegExp,string._M_p);
        if (bVar2) {
          bVar8 = false;
          local_270 = &mocSubDir;
          bVar2 = false;
          pcVar5 = (char *)0x0;
          do {
            cmsys::RegularExpression::match_abi_cxx11_(&currentMoc,&mocIncludeRegExp,1);
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,&currentMoc);
            bVar3 = cmHasLiteralPrefix<std::__cxx11::string,5ul>(&basename,(char (*) [5])0x47f74b);
            if (bVar3) {
              std::__cxx11::string::substr((ulong)local_270,(ulong)&basename);
              std::__cxx11::string::operator=((string *)&basename,(string *)local_270);
              std::__cxx11::string::~string((string *)local_270);
              extractSubDir(local_270,&absPath,&currentMoc);
              findMatchingHeader(&headerToMoc,&absPath,local_270,&basename,headerExtensions);
              if (headerToMoc._M_string_length == 0) {
                poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
                poVar7 = std::operator<<(poVar7,(string *)absFilename);
                poVar7 = std::operator<<(poVar7,": The file ");
                poVar7 = std::operator<<(poVar7,"includes the moc file \"");
                poVar7 = std::operator<<(poVar7,(string *)&currentMoc);
                poVar7 = std::operator<<(poVar7,"\", ");
                poVar7 = std::operator<<(poVar7,"but could not find header \"");
                poVar7 = std::operator<<(poVar7,(string *)&basename);
                this_00 = (cmQtAutoGenerators *)0x7b;
                poVar7 = std::operator<<(poVar7,'{');
                Join(&headerToMoc_1,this_00,headerExtensions,',');
                poVar7 = std::operator<<(poVar7,(string *)&headerToMoc_1);
                std::operator<<(poVar7,"}\" ");
                std::__cxx11::string::~string((string *)&headerToMoc_1);
                if (mocSubDir._M_string_length == 0) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"in ");
                  local_270 = &absPath;
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"neither in ");
                  poVar7 = std::operator<<(poVar7,(string *)&absPath);
                  poVar7 = std::operator<<(poVar7," nor in ");
                }
                poVar7 = std::operator<<(poVar7,(string *)local_270);
                poVar7 = std::operator<<(poVar7,"\n");
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_0029af24;
              }
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](includedMocs,&headerToMoc);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              _Var4 = std::operator==(&basename,&scannedFileBasename);
              if (_Var4) {
                std::__cxx11::string::_M_assign((string *)&ownMocUnderscoreFile);
                bVar2 = true;
                std::__cxx11::string::_M_assign((string *)&ownMocHeaderFile);
              }
              std::__cxx11::string::~string((string *)&headerToMoc);
            }
            else {
              std::__cxx11::string::string((string *)local_270,(string *)absFilename);
              bVar3 = std::operator!=(&basename,&scannedFileBasename);
              if (!bVar3 && bVar1) {
                bVar8 = true;
                std::__cxx11::string::_M_assign((string *)&ownDotMocFile);
              }
              else {
                extractSubDir(&headerToMoc,&absPath,&currentMoc);
                findMatchingHeader(&headerToMoc_1,&absPath,&headerToMoc,&basename,headerExtensions);
                if (headerToMoc_1._M_string_length == 0) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
                  poVar7 = std::operator<<(poVar7,(string *)absFilename);
                  poVar7 = std::operator<<(poVar7,": The file includes the moc file \"");
                  poVar7 = std::operator<<(poVar7,(string *)&currentMoc);
                  poVar7 = std::operator<<(poVar7,
                                           "\", which seems to be the moc file from a different source file. CMake also could not find a matching header.\n"
                                          );
                  std::endl<char,std::char_traits<char>>(poVar7);
                  goto LAB_0029af24;
                }
                std::__cxx11::string::_M_assign((string *)local_270);
                if (bVar1) {
LAB_0029aab7:
                  poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
                  poVar7 = std::operator<<(poVar7,(string *)absFilename);
                  poVar7 = std::operator<<(poVar7,": The file includes the moc file \"");
                  poVar7 = std::operator<<(poVar7,(string *)&currentMoc);
                  poVar7 = std::operator<<(poVar7,"\" instead of \"moc_");
                  poVar7 = std::operator<<(poVar7,(string *)&basename);
                  poVar7 = std::operator<<(poVar7,".cpp\". Running moc on ");
                  poVar7 = std::operator<<(poVar7,"\"");
                  poVar7 = std::operator<<(poVar7,(string *)&headerToMoc_1);
                  poVar7 = std::operator<<(poVar7,"\" ! Include \"moc_");
                  poVar7 = std::operator<<(poVar7,(string *)&basename);
                  pcVar9 = 
                  ".cpp\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n";
                }
                else {
                  _Var4 = std::operator==(&basename,&scannedFileBasename);
                  if (!_Var4) goto LAB_0029aab7;
                  poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
                  poVar7 = std::operator<<(poVar7,(string *)absFilename);
                  poVar7 = std::operator<<(poVar7,": The file includes the moc file \"");
                  poVar7 = std::operator<<(poVar7,(string *)&currentMoc);
                  poVar7 = std::operator<<(poVar7,"\", but does not contain a ");
                  poVar7 = std::operator<<(poVar7,(string *)&macroName);
                  poVar7 = std::operator<<(poVar7," macro. Running moc on ");
                  poVar7 = std::operator<<(poVar7,"\"");
                  poVar7 = std::operator<<(poVar7,(string *)&headerToMoc_1);
                  poVar7 = std::operator<<(poVar7,"\" ! Include \"moc_");
                  poVar7 = std::operator<<(poVar7,(string *)&basename);
                  pcVar9 = 
                  ".cpp\" for a compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n";
                }
                poVar7 = std::operator<<(poVar7,pcVar9);
                std::endl<char,std::char_traits<char>>(poVar7);
                std::__cxx11::string::~string((string *)&headerToMoc_1);
                std::__cxx11::string::~string((string *)&headerToMoc);
              }
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](includedMocs,local_270);
              std::__cxx11::string::_M_assign((string *)pmVar6);
            }
            std::__cxx11::string::~string((string *)local_270);
            pcVar5 = mocIncludeRegExp.endp[0] + ((long)pcVar5 - (long)mocIncludeRegExp.searchstring)
            ;
            std::__cxx11::string::~string((string *)&basename);
            std::__cxx11::string::~string((string *)&currentMoc);
            bVar3 = cmsys::RegularExpression::find
                              (&mocIncludeRegExp,contentsString._M_dataplus._M_p + (long)pcVar5);
          } while (bVar3);
          bVar8 = !bVar8;
        }
        else {
          bVar2 = false;
        }
      }
      if ((bVar1 & bVar8) == 1) {
        if (!bVar2) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
          poVar7 = std::operator<<(poVar7,(string *)absFilename);
          poVar7 = std::operator<<(poVar7,": The file ");
          poVar7 = std::operator<<(poVar7,"contains a ");
          poVar7 = std::operator<<(poVar7,(string *)&macroName);
          poVar7 = std::operator<<(poVar7," macro, but does not include ");
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7,(string *)&scannedFileBasename);
          poVar7 = std::operator<<(poVar7,".moc\" !\n");
          std::endl<char,std::char_traits<char>>(poVar7);
LAB_0029af24:
          exit(1);
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
        poVar7 = std::operator<<(poVar7,(string *)absFilename);
        poVar7 = std::operator<<(poVar7,": The file ");
        poVar7 = std::operator<<(poVar7,"contains a ");
        poVar7 = std::operator<<(poVar7,(string *)&macroName);
        poVar7 = std::operator<<(poVar7," macro, but does not include ");
        poVar7 = std::operator<<(poVar7,"\"");
        poVar7 = std::operator<<(poVar7,(string *)&scannedFileBasename);
        poVar7 = std::operator<<(poVar7,".moc\", but instead includes ");
        poVar7 = std::operator<<(poVar7,"\"");
        poVar7 = std::operator<<(poVar7,(string *)&ownMocUnderscoreFile);
        poVar7 = std::operator<<(poVar7,"\". Running moc on ");
        poVar7 = std::operator<<(poVar7,"\"");
        poVar7 = std::operator<<(poVar7,(string *)absFilename);
        poVar7 = std::operator<<(poVar7,"\" ! Better include \"");
        poVar7 = std::operator<<(poVar7,(string *)&scannedFileBasename);
        poVar7 = std::operator<<(poVar7,
                                 ".moc\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](includedMocs,absFilename);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&includedMocs->_M_t,&ownMocHeaderFile);
      }
      std::__cxx11::string::~string((string *)&ownMocHeaderFile);
      std::__cxx11::string::~string((string *)&ownDotMocFile);
      std::__cxx11::string::~string((string *)&ownMocUnderscoreFile);
      std::__cxx11::string::~string((string *)&macroName);
      std::__cxx11::string::~string((string *)&scannedFileBasename);
      std::__cxx11::string::~string((string *)&absPath);
    }
  }
  std::__cxx11::string::~string((string *)&contentsString);
  cmsys::RegularExpression::~RegularExpression(&mocIncludeRegExp);
  return;
}

Assistant:

void cmQtAutoGenerators::ParseCppFile(const std::string& absFilename,
                const std::vector<std::string>& headerExtensions,
                std::map<std::string, std::string>& includedMocs,
                std::map<std::string, std::vector<std::string> > &includedUis)
{
  cmsys::RegularExpression mocIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]");

  const std::string contentsString = ReadAll(absFilename);
  if (contentsString.empty())
    {
    std::cerr << "AUTOGEN: warning: " << absFilename << ": file is empty\n"
              << std::endl;
    return;
    }
  this->ParseForUic(absFilename, contentsString, includedUis);
  if (this->MocExecutable.empty())
    {
    return;
    }

  const std::string absPath = cmsys::SystemTools::GetFilenamePath(
                   cmsys::SystemTools::GetRealPath(absFilename)) + '/';
  const std::string scannedFileBasename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFilename);
  std::string macroName;
  const bool requiresMoc = requiresMocing(contentsString, macroName);
  bool dotMocIncluded = false;
  bool mocUnderscoreIncluded = false;
  std::string ownMocUnderscoreFile;
  std::string ownDotMocFile;
  std::string ownMocHeaderFile;

  std::string::size_type matchOffset = 0;
  // first a simple string check for "moc" is *much* faster than the regexp,
  // and if the string search already fails, we don't have to try the
  // expensive regexp
  if ((strstr(contentsString.c_str(), "moc") != NULL)
                                    && (mocIncludeRegExp.find(contentsString)))
    {
    // for every moc include in the file
    do
      {
      const std::string currentMoc = mocIncludeRegExp.match(1);
      //std::cout << "found moc include: " << currentMoc << std::endl;

      std::string basename = cmsys::SystemTools::
                                   GetFilenameWithoutLastExtension(currentMoc);
      const bool moc_style = cmHasLiteralPrefix(basename, "moc_");

      // If the moc include is of the moc_foo.cpp style we expect
      // the Q_OBJECT class declaration in a header file.
      // If the moc include is of the foo.moc style we need to look for
      // a Q_OBJECT macro in the current source file, if it contains the
      // macro we generate the moc file from the source file.
      // Q_OBJECT
      if (moc_style)
        {
        // basename should be the part of the moc filename used for
        // finding the correct header, so we need to remove the moc_ part
        basename = basename.substr(4);
        std::string mocSubDir = extractSubDir(absPath, currentMoc);
        std::string headerToMoc = findMatchingHeader(
                               absPath, mocSubDir, basename, headerExtensions);

        if (!headerToMoc.empty())
          {
          includedMocs[headerToMoc] = currentMoc;
          if (basename == scannedFileBasename)
            {
            mocUnderscoreIncluded = true;
            ownMocUnderscoreFile = currentMoc;
            ownMocHeaderFile = headerToMoc;
            }
          }
        else
          {
          std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                    << "includes the moc file \"" << currentMoc << "\", "
                    << "but could not find header \"" << basename
                    << '{' << this->Join(headerExtensions, ',') << "}\" ";
          if (mocSubDir.empty())
            {
            std::cerr << "in " << absPath << "\n" << std::endl;
            }
          else
            {
            std::cerr << "neither in " << absPath
                      << " nor in " << mocSubDir << "\n" << std::endl;
            }

          ::exit(EXIT_FAILURE);
          }
        }
      else
        {
        std::string fileToMoc = absFilename;
        if ((basename != scannedFileBasename) || (requiresMoc==false))
          {
          std::string mocSubDir = extractSubDir(absPath, currentMoc);
          std::string headerToMoc = findMatchingHeader(
                              absPath, mocSubDir, basename, headerExtensions);
          if (!headerToMoc.empty())
            {
            // this is for KDE4 compatibility:
            fileToMoc = headerToMoc;
            if ((requiresMoc==false) &&(basename==scannedFileBasename))
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\", but does not contain a " << macroName
                            << " macro. Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for a compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            else
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\" instead of \"moc_" << basename << ".cpp\". "
                            "Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            }
          else
            {
            std::cerr <<"AUTOGEN: error: " << absFilename << ": The file "
                        "includes the moc file \"" << currentMoc <<
                        "\", which seems to be the moc file from a different "
                        "source file. CMake also could not find a matching "
                        "header.\n" << std::endl;
            ::exit(EXIT_FAILURE);
            }
          }
        else
          {
          dotMocIncluded = true;
          ownDotMocFile = currentMoc;
          }
        includedMocs[fileToMoc] = currentMoc;
        }
      matchOffset += mocIncludeRegExp.end();
      } while(mocIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }

  // In this case, check whether the scanned file itself contains a Q_OBJECT.
  // If this is the case, the moc_foo.cpp should probably be generated from
  // foo.cpp instead of foo.h, because otherwise it won't build.
  // But warn, since this is not how it is supposed to be used.
  if ((dotMocIncluded == false) && (requiresMoc == true))
    {
    if (mocUnderscoreIncluded == true)
      {
      // this is for KDE4 compatibility:
      std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\", but instead "
                   "includes "
                << "\"" << ownMocUnderscoreFile  << "\". Running moc on "
                << "\"" << absFilename << "\" ! Better include \""
                << scannedFileBasename << ".moc\" for compatiblity with "
                   "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                << std::endl;
      includedMocs[absFilename] = ownMocUnderscoreFile;
      includedMocs.erase(ownMocHeaderFile);
      }
    else
      {
      // otherwise always error out since it will not compile:
      std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\" !\n"
                << std::endl;
      ::exit(EXIT_FAILURE);
      }
    }

}